

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<bool_(*)(void_**)>::reallocateAndGrow
          (QArrayDataPointer<bool_(*)(void_**)> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<bool_(*)(void_**)> *old)

{
  long lVar1;
  bool bVar2;
  _func_bool_void_ptr_ptr **pp_Var3;
  QPodArrayOps<bool_(*)(void_**)> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<bool_(*)(void_**)> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<bool_(*)(void_**)> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<bool_(*)(void_**)> *in_stack_ffffffffffffff70;
  QArrayDataPointer<bool_(*)(void_**)> *in_stack_ffffffffffffff78;
  QArrayDataPointer<bool_(*)(void_**)> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<bool_(*)(void_**)> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,
                 in_ESI);
    if ((0 < in_RDX) &&
       (pp_Var3 = data((QArrayDataPointer<bool_(*)(void_**)> *)&stack0xffffffffffffffe0),
       pp_Var3 == (_func_bool_void_ptr_ptr **)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_00236304;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<bool_(*)(void_**)> *)
                  operator->((QArrayDataPointer<bool_(*)(void_**)> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<bool_(*)(void_**)> *)0x236217);
        begin((QArrayDataPointer<bool_(*)(void_**)> *)0x236226);
        QtPrivate::QPodArrayOps<bool_(*)(void_**)>::copyAppend
                  (this_00,(_func_bool_void_ptr_ptr **)in_stack_ffffffffffffff78,
                   (_func_bool_void_ptr_ptr **)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<bool_(*)(void_**)> *)
             operator->((QArrayDataPointer<bool_(*)(void_**)> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<bool_(*)(void_**)> *)0x23625f);
        begin((QArrayDataPointer<bool_(*)(void_**)> *)0x23626e);
        QtPrivate::QPodArrayOps<bool_(*)(void_**)>::moveAppend
                  ((QPodArrayOps<bool_(*)(void_**)> *)in_stack_ffffffffffffff70,
                   (_func_bool_void_ptr_ptr **)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (_func_bool_void_ptr_ptr **)0x23628c);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<bool_(*)(void_**)> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<bool_(*)(void_**)> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<bool_(*)(void_**)>::reallocate
              ((QPodArrayOps<bool_(*)(void_**)> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00236304:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }